

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprogressbar.cpp
# Opt level: O1

void __thiscall QProgressBar::setOrientation(QProgressBar *this,Orientation orientation)

{
  QWidgetPrivate *this_00;
  long *plVar1;
  bool bVar2;
  QSizePolicy QVar3;
  long in_FS_OFFSET;
  QStyleOptionProgressBar option;
  undefined1 local_98 [16];
  undefined1 *local_88;
  undefined1 *puStack_80;
  undefined1 *local_78;
  QPalettePrivate *pQStack_70;
  undefined1 *local_68;
  QObject *pQStack_60;
  undefined1 *local_58;
  undefined1 *puStack_50;
  QArrayData *local_48;
  char16_t *pcStack_40;
  undefined1 *local_38;
  undefined1 *puStack_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidgetPrivate **)&(this->super_QWidget).field_0x8;
  if (*(Orientation *)&this_00[1].field_0x14 != orientation) {
    *(Orientation *)&this_00[1].field_0x14 = orientation;
    bVar2 = QWidget::testAttribute_helper(&this->super_QWidget,WA_WState_OwnSizePolicy);
    if (!bVar2) {
      QVar3 = QWidget::sizePolicy(&this->super_QWidget);
      QWidget::setSizePolicy
                (&this->super_QWidget,
                 (QSizePolicy)
                 ((uint)QVar3.field_0 >> 4 & 0xf0000 | (uint)QVar3.field_0 & 0xff000000 |
                  ((uint)QVar3.field_0 & 0xf0000) << 4 |
                 (uint)(ushort)(QVar3.field_0._0_2_ << 8 | QVar3.field_0._0_2_ >> 8)));
      QWidget::setAttribute(&this->super_QWidget,WA_WState_OwnSizePolicy,false);
    }
    plVar1 = *(long **)&this_00->field_0x8;
    local_38 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
    local_48 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
    pcStack_40 = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    local_58 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
    local_68 = &DAT_aaaaaaaaaaaaaaaa;
    pQStack_60 = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
    local_78 = &DAT_aaaaaaaaaaaaaaaa;
    pQStack_70 = (QPalettePrivate *)&DAT_aaaaaaaaaaaaaaaa;
    local_88 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_80 = &DAT_aaaaaaaaaaaaaaaa;
    local_98._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_98._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QStyleOptionProgressBar::QStyleOptionProgressBar((QStyleOptionProgressBar *)local_98);
    (**(code **)(*plVar1 + 0x1a8))(plVar1,local_98);
    QWidgetPrivate::setLayoutItemMargins(this_00,SE_ProgressBarLayoutItem,(QStyleOption *)local_98);
    if (local_48 != (QArrayData *)0x0) {
      LOCK();
      (local_48->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_48->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_48->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_48,2,0x10);
      }
    }
    QStyleOption::~QStyleOption((QStyleOption *)local_98);
    QWidget::update(&this->super_QWidget);
    QWidget::updateGeometry(&this->super_QWidget);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QProgressBar::setOrientation(Qt::Orientation orientation)
{
    Q_D(QProgressBar);
    if (d->orientation == orientation)
        return;
    d->orientation = orientation;
    if (!testAttribute(Qt::WA_WState_OwnSizePolicy)) {
        setSizePolicy(sizePolicy().transposed());
        setAttribute(Qt::WA_WState_OwnSizePolicy, false);
    }
    d->resetLayoutItemMargins();
    update();
    updateGeometry();
}